

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  u8 uVar2;
  undefined4 uVar3;
  Fts3Cursor *pCsr;
  sqlite3_vtab *pCtx_00;
  u32 *puVar4;
  sqlite3_int64 sVar5;
  Fts3Expr *pFVar6;
  Fts3Expr *pExpr_00;
  Fts3Expr *pFVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined4 *puVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  int iPhrase_1;
  int local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCsr = *pCtx;
  lVar9 = *(long *)((long)pCtx + 0x20);
  lVar10 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  pCtx_00 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred == '\0') || (pExpr->pParent->eType == 1)) {
    local_40[0] = 0;
    if (pExpr->aMI == (u32 *)0x0) {
      pFVar7 = pExpr->pParent;
      pExpr_00 = pExpr;
      while ((pFVar6 = pFVar7, pFVar6 != (Fts3Expr *)0x0 &&
             ((pFVar6->eType == 1 || (pExpr_00->bDeferred != '\0'))))) {
        pFVar7 = pFVar6->pParent;
        pExpr_00 = pFVar6;
      }
      sVar5 = pCsr->iPrevId;
      lVar12 = pExpr_00->iDocid;
      uVar1 = pExpr_00->bEof;
      local_40[1] = 0;
      local_40[0] = fts3ExprIterate2(pExpr_00,local_40 + 1,fts3AllocateMSI,pCtx_00);
      iVar8 = local_40[0];
      if (local_40[0] != 0) goto LAB_001d6cb9;
      fts3EvalRestart(pCsr,pExpr_00,local_40);
      if (local_40[0] == 0 && pCsr->isEof == '\0') {
LAB_001d6bb9:
        do {
          if (pCsr->isRequireSeek == '\0') {
            sqlite3_reset(pCsr->pStmt);
          }
          fts3EvalNextRow(pCsr,pExpr_00,local_40);
          uVar2 = pExpr_00->bEof;
          pCsr->isEof = uVar2;
          pCsr->isRequireSeek = '\x01';
          pCsr->isMatchinfoNeeded = 1;
          pCsr->iPrevId = pExpr_00->iDocid;
          if (uVar2 != '\0') break;
          if (pExpr_00->eType == 1) {
            iVar8 = sqlite3Fts3EvalTestDeferred(pCsr,local_40);
            if (iVar8 != 0) goto LAB_001d6bb9;
            bVar13 = pCsr->isEof != '\0';
          }
          else {
            bVar13 = false;
          }
          if ((((local_40[0] != 0) || (bVar13)) ||
              (fts3EvalUpdateCounts(pExpr_00,*(int *)&pCtx_00[2].pModule), pCsr->isEof != '\0')) ||
             (local_40[0] != 0)) break;
        } while( true );
      }
      pCsr->isEof = '\0';
      pCsr->iPrevId = sVar5;
      if (uVar1 == '\0') {
        fts3EvalRestart(pCsr,pExpr_00,local_40);
        do {
          fts3EvalNextRow(pCsr,pExpr_00,local_40);
          if (pExpr_00->bEof != '\0') {
            iVar8 = 0x10b;
            goto LAB_001d6cb9;
          }
        } while ((pExpr_00->iDocid != lVar12) && (local_40[0] == 0));
      }
      else {
        pExpr_00->bEof = uVar1;
      }
      iVar8 = local_40[0];
      if (local_40[0] != 0) goto LAB_001d6cb9;
    }
    if (0 < *(int *)&pCtx_00[2].pModule) {
      lVar9 = lVar10 * 4 + lVar9;
      puVar4 = pExpr->aMI;
      lVar10 = 8;
      iVar8 = 0;
      lVar12 = 0;
      do {
        *(undefined4 *)(lVar9 + -4 + lVar10) = *(undefined4 *)((long)puVar4 + lVar10 + -4);
        *(undefined4 *)(lVar9 + lVar10) = *(undefined4 *)((long)puVar4 + lVar10);
        lVar12 = lVar12 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar12 < *(int *)&pCtx_00[2].pModule);
      goto LAB_001d6cb9;
    }
  }
  else if (0 < *(int *)&pCtx_00[2].pModule) {
    uVar3 = (undefined4)pCsr->nDoc;
    puVar11 = (undefined4 *)(lVar10 * 4 + 8 + lVar9);
    iVar8 = 0;
    lVar9 = 0;
    do {
      puVar11[-1] = uVar3;
      *puVar11 = uVar3;
      lVar9 = lVar9 + 1;
      puVar11 = puVar11 + 3;
    } while (lVar9 < *(int *)&pCtx_00[2].pModule);
    goto LAB_001d6cb9;
  }
  iVar8 = 0;
LAB_001d6cb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}